

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O1

void nhdp_interfaces_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  plVar2 = (_interface_tree.list_head.next)->prev;
  plVar3 = _interface_tree.list_head.next;
  while (plVar2 != _interface_tree.list_head.prev) {
    plVar1 = plVar3->next;
    if (*(char *)&plVar3[0xe].prev == '\x01') {
      nhdp_interface_remove((nhdp_interface *)&plVar3[-0x16].prev);
    }
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
  return;
}

Assistant:

void
nhdp_interfaces_cleanup(void) {
  struct nhdp_interface *interf, *if_it;

  avl_for_each_element_safe(&_interface_tree, interf, _node, if_it) {
    if (interf->registered) {
      nhdp_interface_remove(interf);
    }
  }

  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
}